

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::MultiThreadedObjectTest::querySetSharedObjects
          (MultiThreadedObjectTest *this,TestThread *thread,int count)

{
  uint uVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppvVar4;
  pointer ppvVar5;
  pointer ppVar6;
  deUint32 dVar7;
  Library *pLVar8;
  pointer ppVar9;
  int iVar10;
  void *pvVar11;
  EndMessageToken *pEVar12;
  void *pvVar13;
  ThreadLog *this_00;
  EGLint value;
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  objectTypes;
  Type local_5c;
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  local_58;
  deRandom *local_38;
  
  pLVar8 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx);
  iVar10 = thread->m_id;
  local_58.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_start = (Type *)0x0;
  local_58.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Type *)0x0;
  local_58.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Type *)0x0;
  if ((this->m_types & TYPE_PBUFFER) != 0) {
    local_5c = TYPE_PBUFFER;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>(&local_58,(iterator)0x0,&local_5c)
    ;
  }
  if ((this->m_types & TYPE_PIXMAP) != 0) {
    local_5c = TYPE_PIXMAP;
    if (local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
    }
    else {
      *local_58.
       super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
       ._M_impl.super__Vector_impl_data._M_finish = TYPE_PIXMAP;
      local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (((this->m_sharedNativeWindows).
       super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->m_sharedNativeWindows).
       super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((this->m_types & TYPE_WINDOW) != 0)) {
    local_5c = TYPE_WINDOW;
    if (local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
    }
    else {
      *local_58.
       super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
       ._M_impl.super__Vector_impl_data._M_finish = TYPE_WINDOW;
      local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((this->m_types & TYPE_CONTEXT) != 0) {
    local_5c = TYPE_CONTEXT;
    if (local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
    }
    else {
      *local_58.
       super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
       ._M_impl.super__Vector_impl_data._M_finish = TYPE_CONTEXT;
      local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (0 < count) {
    local_38 = &(&this->m_rnd0)[iVar10 != 0].m_rnd;
    this_00 = &thread->m_log;
    do {
      local_5c = 0;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type*,std::vector<deqp::egl::MultiThreadedObjectTest::Type,std::allocator<deqp::egl::MultiThreadedObjectTest::Type>>>,deqp::egl::MultiThreadedObjectTest::Type*>
                ((Random *)local_38,
                 (__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
                  )local_58.
                   super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
                  )local_58.
                   super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_5c,1);
      if ((int)local_5c < 4) {
        if (local_5c == TYPE_PBUFFER) {
          ppvVar4 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppvVar5 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          dVar7 = deRandom_getUint32(local_38);
          pvVar11 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(int)((ulong)dVar7 % ((ulong)((long)ppvVar5 - (long)ppvVar4) >> 3 & 0xffffffff)
                          )];
LAB_00e24cc1:
          pvVar13 = (void *)0x0;
        }
        else {
          pvVar13 = (void *)0x0;
          pvVar11 = (void *)0x0;
          if (local_5c == TYPE_PIXMAP) {
            ppVar2 = (this->m_sharedNativePixmaps).
                     super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3 = (this->m_sharedNativePixmaps).
                     super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            dVar7 = deRandom_getUint32(local_38);
            iVar10 = (int)((ulong)dVar7 % ((ulong)((long)ppVar3 - (long)ppVar2) >> 4 & 0xffffffff));
            ppVar9 = (pointer)(this->m_sharedNativePixmaps).
                              super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_00e24cb8;
          }
        }
      }
      else {
        if (local_5c == TYPE_WINDOW) {
          ppVar9 = (this->m_sharedNativeWindows).
                   super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar6 = (this->m_sharedNativeWindows).
                   super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          dVar7 = deRandom_getUint32(local_38);
          iVar10 = (int)((ulong)dVar7 % ((ulong)((long)ppVar6 - (long)ppVar9) >> 4 & 0xffffffff));
          ppVar9 = (this->m_sharedNativeWindows).
                   super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_00e24cb8:
          pvVar11 = ppVar9[iVar10].second;
          goto LAB_00e24cc1;
        }
        pvVar13 = (void *)0x0;
        pvVar11 = (void *)0x0;
        if (local_5c == TYPE_CONTEXT) {
          ppvVar4 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppvVar5 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          dVar7 = deRandom_getUint32(local_38);
          pvVar13 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(int)((ulong)dVar7 % ((ulong)((long)ppvVar5 - (long)ppvVar4) >> 3 & 0xffffffff)
                          )];
          pvVar11 = (void *)0x0;
        }
      }
      if (pvVar11 == (void *)0x0) {
        if (pvVar13 != (void *)0x0) {
          dVar7 = deRandom_getUint32(local_38);
          uVar1 = querySetSharedObjects::attributes[dVar7 & 3];
          (*pLVar8->_vptr_Library[0x29])
                    (pLVar8,(this->super_MultiThreadedTest).m_display,pvVar13,(ulong)uVar1,&local_5c
                    );
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," = eglQueryContext(",0x13);
          std::ostream::_M_insert<void_const*>(this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<void_const*>(this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::operator<<(this_00,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::operator<<(this_00,local_5c);
          pEVar12 = (EndMessageToken *)0x1b186b7;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
          ThreadLog::operator<<(this_00,pEVar12);
          dVar7 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
          eglu::checkError(dVar7,"eglQueryContext()",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                           ,0x591);
        }
      }
      else {
        dVar7 = deRandom_getUint32(local_38);
        uVar1 = querySetSharedObjects::queryAttributes[dVar7 % 3];
        (*pLVar8->_vptr_Library[0x2b])
                  (pLVar8,(this->super_MultiThreadedTest).m_display,pvVar11,(ulong)uVar1,&local_5c);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," = eglQuerySurface(",0x13);
        std::ostream::_M_insert<void_const*>(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<void_const*>(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,uVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,local_5c);
        pEVar12 = (EndMessageToken *)0x1b186b7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
        ThreadLog::operator<<(this_00,pEVar12);
        dVar7 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
        eglu::checkError(dVar7,"eglQuerySurface()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x57e);
      }
      count = count + -1;
    } while (count != 0);
  }
  if (local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::querySetSharedObjects (TestThread& thread, int count)
{
	const Library&		egl		= getLibrary();
	de::Random&			rnd		= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<Type>		objectTypes;

	if ((m_types & TYPE_PBUFFER) != 0)
		objectTypes.push_back(TYPE_PBUFFER);

	if ((m_types & TYPE_PIXMAP) != 0)
		objectTypes.push_back(TYPE_PIXMAP);

	if (!m_sharedNativeWindows.empty() && (m_types & TYPE_WINDOW) != 0)
		objectTypes.push_back(TYPE_WINDOW);

	if ((m_types & TYPE_CONTEXT) != 0)
		objectTypes.push_back(TYPE_CONTEXT);

	for (int queryNdx = 0; queryNdx < count; queryNdx++)
	{
		const Type	type		= rnd.choose<Type>(objectTypes.begin(), objectTypes.end());
		EGLSurface	surface		= EGL_NO_SURFACE;
		EGLContext	context		= EGL_NO_CONTEXT;

		switch (type)
		{
			case TYPE_PBUFFER:
				surface = m_sharedPbuffers[rnd.getInt(0, (int)(m_sharedPbuffers.size()-1))];
				break;

			case TYPE_PIXMAP:
				surface = m_sharedNativePixmaps[rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1))].second;
				break;

			case TYPE_WINDOW:
				surface = m_sharedNativeWindows[rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1))].second;
				break;

			case TYPE_CONTEXT:
				context = m_sharedContexts[rnd.getInt(0, (int)(m_sharedContexts.size()-1))];
				break;

			default:
				DE_ASSERT(false);
		}

		if (surface != EGL_NO_SURFACE)
		{
			static const EGLint queryAttributes[] =
			{
				EGL_LARGEST_PBUFFER,
				EGL_HEIGHT,
				EGL_WIDTH
			};

			const EGLint	attribute	= queryAttributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(queryAttributes) - 1)];
			EGLBoolean		result;
			EGLint			value;

			result = egl.querySurface(m_display, surface, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQuerySurface(" << m_display << ", " << surface << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQuerySurface()");

		}
		else if (context != EGL_NO_CONTEXT)
		{
			static const EGLint attributes[] =
			{
				EGL_CONFIG_ID,
				EGL_CONTEXT_CLIENT_TYPE,
				EGL_CONTEXT_CLIENT_VERSION,
				EGL_RENDER_BUFFER
			};

			const EGLint	attribute = attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLint			value;
			EGLBoolean		result;

			result = egl.queryContext(m_display, context, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQueryContext(" << m_display << ", " << context << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQueryContext()");

		}
		else
			DE_ASSERT(false);
	}
}